

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O3

double betapdf(double x,double a,double b)

{
  char *__format;
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = 0.0;
  if ((x < 0.0) || (1.0 < x)) {
    __format = "x only accepts real values between 0.0 and 1.0";
  }
  else {
    if ((0.0 <= a) && (0.0 <= b)) {
      if (((x != 0.0) || (NAN(x))) && ((a != 1.0 || (NAN(a))))) {
        dVar1 = log(x);
        dVar1 = dVar1 * (a + -1.0);
      }
      dVar2 = 0.0;
      if (((x != 1.0) || (NAN(x))) && ((b != 1.0 || (NAN(b))))) {
        dVar2 = log(1.0 - x);
        dVar2 = dVar2 * (b + -1.0);
      }
      dVar3 = beta_log(a,b);
      dVar1 = exp((dVar1 + dVar2) - dVar3);
      return dVar1;
    }
    __format = " The Two Inputs should be nonnegative and real";
  }
  printf(__format);
  exit(1);
}

Assistant:

double betapdf(double x, double a , double b) {
	double oup,la,lb;
	/*
	 * The pdf of Beta distribution function is given by
	 * x^(a-1) * (1-x)^(b-1) / B(a,b)
	 * 
	 * or
	 * 
	 * exp((a-1)*log(x) + (b-1)*log(1-x) - beta_log(a,b))
	 * 
	 * Ref 26.1.33 Abramowitz and Stegun
	 */ 
	 
	if (x < 0. || x > 1.) {
		printf("x only accepts real values between 0.0 and 1.0");
		exit(1);
	}
	if (a < 0. || b < 0.) {
		printf(" The Two Inputs should be nonnegative and real");
		exit(1);
	} 
	
	if (a == 1. || x == 0.) {
		la = 0.;
	} else {
		la = (a - 1.) * log(x);
	}
	
	if (b == 1. || x == 1.) {
		lb = 0.;
	} else {
		lb = (b - 1.) * log(1. - x);
	}
	
	oup = exp(la + lb - beta_log(a,b));
	
	return oup;
}